

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * __thiscall CMU462::Matrix3x3::T(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this)

{
  Matrix3x3 *pMVar1;
  int i;
  long lVar2;
  Matrix3x3 *A;
  Matrix3x3 *B;
  Vector3D *pVVar3;
  int j;
  long lVar4;
  
  pMVar1 = __return_storage_ptr__;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    lVar4 = 0;
    pVVar3 = __return_storage_ptr__->entries;
    for (; lVar4 != 3; lVar4 = lVar4 + 1) {
      ((Vector3D *)&pVVar3->x)->x = (&((Vector3D *)&this->entries[0].x)->x)[lVar4];
      pVVar3 = pVVar3 + 1;
    }
    this = (Matrix3x3 *)((long)this + 0x18);
    __return_storage_ptr__ = (Matrix3x3 *)&__return_storage_ptr__->entries[0].y;
  }
  return pMVar1;
}

Assistant:

Matrix3x3 Matrix3x3::T( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       B(i,j) = A(j,i);
    }

    return B;
  }